

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O3

bool google::glog_internal_namespace_::SafeFNMatch_
               (char *pattern,size_t patt_len,char *str,size_t str_len)

{
  char cVar1;
  char *str_00;
  size_t str_len_00;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  
  bVar3 = str_len == 0;
  if (patt_len == 0) {
    return bVar3;
  }
  sVar2 = 0;
  while( true ) {
    if (bVar3) {
      if (patt_len - 1 != sVar2) {
        return false;
      }
      return pattern[sVar2] == '*';
    }
    cVar1 = pattern[sVar2];
    if ((cVar1 != '?') && (cVar1 != str[sVar2])) break;
    bVar3 = str_len - 1 == sVar2;
    sVar2 = sVar2 + 1;
    if (patt_len == sVar2) {
      return bVar3;
    }
  }
  if (cVar1 != '*') {
    return false;
  }
  if (patt_len - 1 != sVar2) {
    str_00 = str + sVar2;
    str_len_00 = str_len - sVar2;
    do {
      bVar3 = SafeFNMatch_(pattern + sVar2 + 1,~sVar2 + patt_len,str_00,str_len_00);
      if (bVar3) {
        return bVar3;
      }
      str_00 = str_00 + 1;
      bVar4 = str_len_00 != 1;
      str_len_00 = str_len_00 - 1;
    } while (bVar4);
    return bVar3;
  }
  return true;
}

Assistant:

GOOGLE_GLOG_DLL_DECL bool SafeFNMatch_(const char* pattern,
                                       size_t patt_len,
                                       const char* str,
                                       size_t str_len) {
  size_t p = 0;
  size_t s = 0;
  while (1) {
    if (p == patt_len  &&  s == str_len) return true;
    if (p == patt_len) return false;
    if (s == str_len) return p+1 == patt_len  &&  pattern[p] == '*';
    if (pattern[p] == str[s]  ||  pattern[p] == '?') {
      p += 1;
      s += 1;
      continue;
    }
    if (pattern[p] == '*') {
      if (p+1 == patt_len) return true;
      do {
        if (SafeFNMatch_(pattern+(p+1), patt_len-(p+1), str+s, str_len-s)) {
          return true;
        }
        s += 1;
      } while (s != str_len);
      return false;
    }
    return false;
  }
}